

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

UOConfig * __thiscall QPDFJob::UOConfig::file(UOConfig *this,string *parameter)

{
  string *psVar1;
  ulong uVar2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *parameter_local;
  UOConfig *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this->config->o);
  uVar2 = std::__cxx11::string::empty();
  psVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->config->o);
    std::operator+(&local_38,&peVar3->under_overlay->which," file already specified");
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->config->o);
    std::__cxx11::string::operator=((string *)&peVar3->under_overlay->filename,(string *)psVar1);
  }
  return this;
}

Assistant:

QPDFJob::UOConfig*
QPDFJob::UOConfig::file(std::string const& parameter)
{
    if (!config->o.m->under_overlay->filename.empty()) {
        usage(config->o.m->under_overlay->which + " file already specified");
    } else {
        config->o.m->under_overlay->filename = parameter;
    }
    return this;
}